

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O0

Image * Image_Function::Median(Image *in,uint32_t kernelSize)

{
  ImageTemplate<unsigned_char> *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  uint32_t in_stack_000000d8;
  uint32_t in_stack_000000dc;
  Image *in_stack_000000e0;
  uint32_t in_stack_000000e8;
  uint32_t in_stack_000000ec;
  Image *in_stack_000000f0;
  uint32_t in_stack_00000100;
  uint32_t in_stack_00000108;
  uint32_t in_stack_00000110;
  uint8_t in_stack_ffffffffffffffa6;
  uint8_t in_stack_ffffffffffffffa7;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac
             ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa6);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
  Median(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,
         in_stack_000000d8,in_stack_00000100,in_stack_00000108,in_stack_00000110);
  return in_RDI;
}

Assistant:

Image Median( const Image & in, uint32_t kernelSize )
    {
        ParameterValidation( in );

        Image out( in.width(), in.height() );

        Median( in, 0, 0, out, 0, 0, out.width(), out.height(), kernelSize );

        return out;
    }